

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.cpp
# Opt level: O0

bool std::operator==(set<char,_std::less<char>,_std::allocator<char>_> *s,
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  _Rb_tree_const_iterator<char> local_60;
  pair<std::_Rb_tree_const_iterator<char>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  char *local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  _Rb_tree_const_iterator<char> local_38;
  _Rb_tree_const_iterator<char> local_30;
  pair<std::_Rb_tree_const_iterator<char>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l_local;
  set<char,_std::less<char>,_std::allocator<char>_> *s_local;
  
  local_18 = l;
  l_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s;
  local_30._M_node = (_Base_ptr)set<char,_std::less<char>,_std::allocator<char>_>::begin(s);
  local_38._M_node =
       (_Base_ptr)
       set<char,_std::less<char>,_std::allocator<char>_>::end
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)l_local);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48 = (char *)std::__cxx11::string::end();
  local_28 = mismatch<std::_Rb_tree_const_iterator<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       (local_30,local_38,local_40,
                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_48);
  local_60._M_node =
       (_Base_ptr)
       set<char,_std::less<char>,_std::allocator<char>_>::end
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)l_local);
  local_68._M_current = (char *)std::__cxx11::string::end();
  local_58 = make_pair<std::_Rb_tree_const_iterator<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       (&local_60,&local_68);
  bVar1 = operator==(&local_28,&local_58);
  return bVar1;
}

Assistant:

bool operator == (const std::set<T, C, A> & s, const Coll & l)
    {
        return std::mismatch(s.begin(), s.end(), l.begin(), l.end()) == std::make_pair(s.end(), l.end());
    }